

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O0

void rt_copy1col_c(int hx,int sx,int yl,int yh)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int pitch;
  int count;
  BYTE *dest;
  BYTE *source;
  int yh_local;
  int yl_local;
  int sx_local;
  int hx_local;
  
  iVar1 = dc_pitch;
  if (-1 < yh - yl) {
    uVar2 = (yh - yl) + 1;
    _pitch = dc_destorg + (ylookup[yl] + sx);
    dest = dc_temp + (yl * 4 + hx);
    if ((uVar2 & 1) != 0) {
      *_pitch = *dest;
      dest = dest + 4;
      _pitch = _pitch + iVar1;
    }
    if ((uVar2 & 2) != 0) {
      *_pitch = *dest;
      _pitch[iVar1] = dest[4];
      dest = dest + 8;
      _pitch = _pitch + (iVar1 << 1);
    }
    for (iVar3 = (int)uVar2 >> 2; iVar3 != 0; iVar3 = iVar3 + -1) {
      *_pitch = *dest;
      _pitch[iVar1] = dest[4];
      _pitch[iVar1 << 1] = dest[8];
      _pitch[iVar1 * 3] = dest[0xc];
      dest = dest + 0x10;
      _pitch = _pitch + (iVar1 << 2);
    }
  }
  return;
}

Assistant:

void rt_copy1col_c (int hx, int sx, int yl, int yh)
{
	BYTE *source;
	BYTE *dest;
	int count;
	int pitch;

	count = yh-yl;
	if (count < 0)
		return;
	count++;

	dest = ylookup[yl] + sx + dc_destorg;
	source = &dc_temp[yl*4 + hx];
	pitch = dc_pitch;

	if (count & 1) {
		*dest = *source;
		source += 4;
		dest += pitch;
	}
	if (count & 2) {
		dest[0] = source[0];
		dest[pitch] = source[4];
		source += 8;
		dest += pitch*2;
	}
	if (!(count >>= 2))
		return;

	do {
		dest[0] = source[0];
		dest[pitch] = source[4];
		dest[pitch*2] = source[8];
		dest[pitch*3] = source[12];
		source += 16;
		dest += pitch*4;
	} while (--count);
}